

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O1

bool embree::AccelN::pointQuery(Intersectors *This_in,PointQuery *query,PointQueryContext *context)

{
  AccelData *pAVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  
  pAVar1 = This_in->ptr;
  lVar3 = *(long *)&pAVar1[3].type;
  if (*(long *)&pAVar1[3].field_0x58 == lVar3) {
    bVar5 = 0;
  }
  else {
    uVar4 = 0;
    bVar5 = 0;
    do {
      lVar3 = *(long *)(lVar3 + uVar4 * 8);
      if (*(float *)(lVar3 + 0x10) < INFINITY) {
        bVar2 = (**(code **)(lVar3 + 0x88))(lVar3 + 0x58,query,context);
        bVar5 = bVar5 | bVar2;
      }
      uVar4 = uVar4 + 1;
      lVar3 = *(long *)&pAVar1[3].type;
    } while (uVar4 < (ulong)(*(long *)&pAVar1[3].field_0x58 - lVar3 >> 3));
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool AccelN::pointQuery (Accel::Intersectors* This_in, PointQuery* query, PointQueryContext* context)
  {
    bool changed = false;
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++)
      if (!This->accels[i]->isEmpty())
        changed |= This->accels[i]->intersectors.pointQuery(query,context);
    return changed;
  }